

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O2

RK_S32 h265e_code_slice_skip_frame(void *ctx,H265eSlice *slice,RK_U8 *buf,RK_S32 len)

{
  int iVar1;
  RK_U32 RVar2;
  RK_U32 RVar3;
  uint uVar4;
  RK_S32 RVar5;
  ulong uVar6;
  TileInfo local_78;
  MppWriteCtx bitIf;
  
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_slice","enter\n","h265e_code_slice_skip_frame");
  }
  if (buf == (RK_U8 *)0x0 || len == 0) {
    _mpp_log_l(2,"h265e_slice","buf or size no set",(char *)0x0);
    RVar5 = -1;
  }
  else {
    mpp_writer_init(&bitIf,buf,len);
    local_78.ctu_addr = 0;
    local_78.tile_start_y = 0;
    local_78.tile_end_y = *(int *)((long)ctx + 0x1658) - 1;
    uVar4 = *(uint *)((long)ctx + 0x4d3c);
    if (uVar4 == 0) {
      uVar4 = *(uint *)((long)ctx + 0x1664);
      local_78.tile_end_x = *(int *)((long)ctx + 0x1654) - 1;
      local_78.mb_total =
           ((local_78.tile_end_y + uVar4) / uVar4) *
           (((*(int *)((long)ctx + 0x1654) + uVar4) - 1) / uVar4);
      local_78.tile_start_x = 0;
      h265e_code_skip_tile(ctx,slice,&bitIf,&local_78);
    }
    else {
      local_78.tile_start_x = 0;
      for (uVar6 = 0; RVar3 = local_78.ctu_addr, RVar2 = local_78.tile_start_x,
          (long)uVar6 <= (long)(int)uVar4; uVar6 = uVar6 + 1) {
        iVar1 = *(int *)((long)ctx + uVar6 * 4 + 0x4d40);
        local_78.mb_total = *(int *)((long)ctx + uVar6 * 4 + 0x4dc8) * iVar1;
        if (uVar6 == uVar4) {
          iVar1 = *(int *)((long)ctx + 0x1654);
        }
        else {
          iVar1 = local_78.tile_start_x + iVar1 * *(int *)((long)ctx + 0x1664);
        }
        local_78.tile_end_x = iVar1 - 1;
        h265e_code_skip_tile(ctx,slice,&bitIf,&local_78);
        iVar1 = *(int *)((long)ctx + uVar6 * 4 + 0x4d40);
        local_78.tile_start_x = RVar2 + *(int *)((long)ctx + 0x1664) * iVar1;
        local_78.ctu_addr = RVar3 + iVar1;
        uVar4 = *(uint *)((long)ctx + 0x4d3c);
      }
    }
    if (((byte)h265e_debug & 1) != 0) {
      _mpp_log_l(4,"h265e_slice","leave\n","h265e_code_slice_skip_frame");
    }
    RVar5 = mpp_writer_bytes(&bitIf);
  }
  return RVar5;
}

Assistant:

RK_S32 h265e_code_slice_skip_frame(void *ctx, H265eSlice *slice, RK_U8 *buf, RK_S32 len)
{
    H265eCtx *p = (H265eCtx *)ctx;
    H265eSps *sps = &p->sps;
    H265ePps *pps = &p->pps;
    TileInfo tile;
    MppWriteCtx bitIf;
    RK_U32 mb_wd;
    RK_U32 mb_h;
    RK_S32 i;

    h265e_dbg_func("enter\n");
    if (!buf || !len) {
        mpp_err("buf or size no set");
        return MPP_NOK;
    }

    mpp_writer_init(&bitIf, buf, len);
    tile.ctu_addr = 0;
    tile.tile_start_y = 0;
    tile.tile_end_y = sps->m_picHeightInLumaSamples - 1;

    if (pps->m_nNumTileColumnsMinus1) {
        tile.tile_start_x = 0;
        for (i = 0; i <= pps->m_nNumTileColumnsMinus1; i++) {
            tile.mb_total = pps->m_nTileColumnWidthArray[i] * pps->m_nTileRowHeightArray[i];
            if (i != pps->m_nNumTileColumnsMinus1)
                tile.tile_end_x = tile.tile_start_x +
                                  (pps->m_nTileColumnWidthArray[i] * sps->m_maxCUSize) - 1;
            else
                tile.tile_end_x = sps->m_picWidthInLumaSamples - 1;
            h265e_code_skip_tile(ctx, slice, &bitIf, &tile);
            tile.tile_start_x += (pps->m_nTileColumnWidthArray[i] * sps->m_maxCUSize);
            tile.ctu_addr += pps->m_nTileColumnWidthArray[i];
        }
    } else {
        mb_wd = (sps->m_picWidthInLumaSamples + sps->m_maxCUSize - 1) / sps->m_maxCUSize;
        mb_h = (sps->m_picHeightInLumaSamples + sps->m_maxCUSize - 1) / sps->m_maxCUSize;
        tile.mb_total = mb_wd * mb_h;
        tile.tile_start_x = 0;
        tile.tile_end_x = sps->m_picWidthInLumaSamples - 1;
        h265e_code_skip_tile(ctx, slice, &bitIf, &tile);
    }

    h265e_dbg_func("leave\n");
    return mpp_writer_bytes(&bitIf);
}